

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array
          (Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  size_t sVar2;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }